

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflickgesture.cpp
# Opt level: O1

Result __thiscall
QFlickGestureRecognizer::recognize
          (QFlickGestureRecognizer *this,QGesture *state,QObject *watched,QEvent *event)

{
  undefined8 *puVar1;
  ushort uVar2;
  QScroller *this_00;
  QScroller *this_01;
  QWidgetData *pQVar3;
  undefined8 uVar4;
  char cVar5;
  undefined4 uVar6;
  QFlagsStorage<Qt::MouseButton> eventButtons;
  MouseButton MVar7;
  int iVar8;
  State SVar9;
  State SVar10;
  uint uVar11;
  QFlagsStorage<Qt::MouseButton> QVar12;
  State SVar13;
  long lVar14;
  PressDelayHandler *pPVar15;
  QEvent *pQVar16;
  QWidget *pQVar17;
  QPoint QVar18;
  QGraphicsScene *this_02;
  ulong uVar19;
  long lVar20;
  qint64 timestamp;
  QEvent *pQVar21;
  Input IVar22;
  ulong uVar23;
  QWidget *pQVar24;
  Input IVar25;
  uint uVar26;
  QFlagsStorage<QGestureRecognizer::ResultFlag> QVar27;
  undefined8 *puVar28;
  QEvent *this_03;
  long lVar29;
  QGraphicsItem *this_04;
  long in_FS_OFFSET;
  bool bVar30;
  bool scrollerIsActive;
  double extraout_XMM0_Qa;
  double dVar31;
  double extraout_XMM1_Qa;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  QRegion scrollerRegion;
  QPoint globalPos;
  QFlagsStorage<Qt::KeyboardModifier> local_1a4;
  QPoint local_f8;
  QPolygon local_f0;
  QPolygon local_d8;
  QRegion local_c0;
  QPolygonF local_b8;
  QPoint local_a0;
  QArrayData *local_98;
  undefined8 *puStack_90;
  QScrollerPrivate *local_88;
  QPointF local_78;
  QPoint local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar5 = QElapsedTimer::isValid();
  if (cVar5 == '\0') {
    QElapsedTimer::start();
  }
  lVar20 = *(long *)&state->field_0x8;
  this_00 = *(QScroller **)(lVar20 + 0xb8);
  QVar27.i = 1;
  if (this_00 == (QScroller *)0x0) goto LAB_0065fed3;
  if ((*(long *)(lVar20 + 0xa8) == 0) || (*(int *)(*(long *)(lVar20 + 0xa8) + 4) == 0)) {
    lVar14 = 0;
  }
  else {
    lVar14 = *(long *)(lVar20 + 0xb0);
  }
  if (lVar14 == 0) {
    bVar30 = true;
  }
  else {
    bVar30 = (*(byte *)(*(long *)(lVar14 + 8) + 0x30) & 1) == 0;
  }
  lVar14 = QMetaObject::cast((QObject *)&QGraphicsObject::staticMetaObject);
  pPVar15 = PressDelayHandler::instance();
  if (pPVar15->sendingEvent != false) goto LAB_0065fed3;
  local_60.xp.m_i = 0;
  local_60.yp.m_i = 0;
  uVar2 = *(ushort *)(event + 8);
  eventButtons.i = 0;
  if (uVar2 < 0x1f) {
    if (1 < uVar2 - 2) {
      if (uVar2 == 4) {
        SVar9 = QScroller::state(this_00);
LAB_0065f323:
        QVar27.i = 0x101;
        if (SVar9 != Inactive) goto LAB_0065fed3;
        goto LAB_0065f32b;
      }
      local_1a4.i = 0;
      pQVar21 = (QEvent *)0x0;
      this_03 = (QEvent *)0x0;
      pQVar16 = (QEvent *)0x0;
      if (uVar2 != 5) goto LAB_0065f33d;
    }
    QVar27.i = 1;
    if (bVar30) goto LAB_0065fed3;
    if (this->button == NoButton) goto LAB_0065f32b;
    local_1a4.i = *(Int *)(event + 0x20);
    eventButtons.i = *(Int *)(event + 0x44);
    uVar6 = QEventPoint::globalPosition();
    auVar32._0_8_ =
         (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM1_Qa;
    auVar32._8_8_ =
         (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM0_Qa;
    auVar32 = minpd(_DAT_0066f5d0,auVar32);
    auVar33._8_8_ = -(ulong)(-2147483648.0 < auVar32._8_8_);
    auVar33._0_8_ = -(ulong)(-2147483648.0 < auVar32._0_8_);
    uVar11 = movmskpd(uVar6,auVar33);
    uVar23 = 0x8000000000000000;
    if ((uVar11 & 1) != 0) {
      uVar23 = (ulong)(uint)(int)auVar32._0_8_ << 0x20;
    }
    uVar19 = 0x80000000;
    if ((uVar11 & 2) != 0) {
      uVar19 = (ulong)(uint)(int)auVar32._8_8_;
    }
    local_60 = (QPoint)(uVar19 | uVar23);
    pQVar21 = (QEvent *)0x0;
    this_03 = (QEvent *)0x0;
    pQVar16 = event;
  }
  else {
    if (uVar2 - 0x9b < 3) {
      if (lVar14 == 0) {
LAB_0065fe0f:
        QVar27.i = 1;
        goto LAB_0065fed3;
      }
      if (this->button == NoButton) goto LAB_0065f32b;
      local_1a4.i = (Int)QGraphicsSceneMouseEvent::modifiers((QGraphicsSceneMouseEvent *)event);
      eventButtons.i = (Int)QGraphicsSceneMouseEvent::buttons((QGraphicsSceneMouseEvent *)event);
      local_60 = QGraphicsSceneMouseEvent::screenPos((QGraphicsSceneMouseEvent *)event);
      pQVar21 = (QEvent *)0x0;
      this_03 = event;
    }
    else {
      if (2 < uVar2 - 0xc2) {
        local_1a4.i = 0;
        pQVar21 = (QEvent *)0x0;
        this_03 = (QEvent *)0x0;
        pQVar16 = (QEvent *)0x0;
        if (uVar2 == 0x1f) {
          QVar27.i = 0x101;
          if (*(char *)(lVar20 + 0xc4) != '\0') goto LAB_0065fed3;
          SVar9 = QScroller::state(this_00);
          goto LAB_0065f323;
        }
        goto LAB_0065f33d;
      }
      if (this->button == NoButton) {
        local_1a4.i = *(Int *)(event + 0x20);
        pQVar21 = event;
        if (*(long *)(event + 0x38) != 0) {
          local_58._0_16_ = QEventPoint::globalPosition();
          local_60 = QPointF::toPoint((QPointF *)&local_58);
        }
      }
      else {
LAB_0065f32b:
        local_1a4.i = 0;
        pQVar21 = (QEvent *)0x0;
      }
      eventButtons.i = 0;
      this_03 = (QEvent *)0x0;
    }
    pQVar16 = (QEvent *)0x0;
  }
LAB_0065f33d:
  bVar30 = this_03 != (QEvent *)0x0 || pQVar16 != (QEvent *)0x0;
  QVar27.i = 1;
  if ((this_03 == (QEvent *)0x0 && pQVar16 == (QEvent *)0x0) && pQVar21 == (QEvent *)0x0)
  goto LAB_0065fed3;
  local_78 = (QPointF)ZEXT816(0);
  uVar2 = *(ushort *)(event + 8);
  IVar25 = 0;
  IVar22 = IVar25;
  if (uVar2 < 0x9c) {
    if (uVar2 < 5) {
      if (uVar2 == 2) {
        if (pQVar16 != (QEvent *)0x0) {
          if ((*(MouseButton *)(pQVar16 + 0x40) != this->button) ||
             (*(MouseButton *)(pQVar16 + 0x44) != this->button)) goto LAB_0065fd34;
          auVar32 = QEventPoint::globalPosition();
          local_58._0_16_ = auVar32;
          QVar18 = QPointF::toPoint((QPointF *)&local_58);
          local_78.yp = (double)QVar18.yp.m_i.m_i;
          local_78.xp = (double)QVar18.xp.m_i.m_i;
LAB_0065fbc2:
          IVar22 = InputPress;
        }
      }
      else if (((uVar2 == 3) && (pQVar16 != (QEvent *)0x0)) &&
              (*(MouseButton *)(pQVar16 + 0x40) == this->button)) {
        auVar32 = QEventPoint::globalPosition();
        local_58._0_16_ = auVar32;
        QVar18 = QPointF::toPoint((QPointF *)&local_58);
        local_78.yp = (double)QVar18.yp.m_i.m_i;
        local_78.xp = (double)QVar18.xp.m_i.m_i;
LAB_0065f48c:
        IVar22 = InputRelease;
      }
    }
    else if (uVar2 == 5) {
      if ((pQVar16 != (QEvent *)0x0) && (*(MouseButton *)(pQVar16 + 0x44) == this->button)) {
        auVar32 = QEventPoint::globalPosition();
        local_58._0_16_ = auVar32;
        QVar18 = QPointF::toPoint((QPointF *)&local_58);
        local_78.yp = (double)QVar18.yp.m_i.m_i;
        local_78.xp = (double)QVar18.xp.m_i.m_i;
LAB_0065f543:
        IVar22 = InputMove;
      }
    }
    else if ((uVar2 == 0x9b) && (this_03 != (QEvent *)0x0)) {
      QVar12.i = (Int)QGraphicsSceneMouseEvent::buttons((QGraphicsSceneMouseEvent *)this_03);
      if (QVar12.i == this->button) {
        local_78 = QGraphicsSceneMouseEvent::scenePos((QGraphicsSceneMouseEvent *)this_03);
        goto LAB_0065f543;
      }
    }
  }
  else if (uVar2 < 0xc2) {
    if (uVar2 == 0x9c) {
      if (this_03 != (QEvent *)0x0) {
        MVar7 = QGraphicsSceneMouseEvent::button((QGraphicsSceneMouseEvent *)this_03);
        if (MVar7 == this->button) {
          QVar12.i = (Int)QGraphicsSceneMouseEvent::buttons((QGraphicsSceneMouseEvent *)this_03);
          if (QVar12.i == this->button) {
            local_78 = QGraphicsSceneMouseEvent::scenePos((QGraphicsSceneMouseEvent *)this_03);
            goto LAB_0065fbc2;
          }
        }
LAB_0065fd34:
        QScroller::stop(this_00);
        QVar27.i = 0x10;
        goto LAB_0065fed3;
      }
    }
    else {
      IVar22 = 0;
      if ((uVar2 == 0x9d) && (IVar22 = IVar25, this_03 != (QEvent *)0x0)) {
        MVar7 = QGraphicsSceneMouseEvent::button((QGraphicsSceneMouseEvent *)this_03);
        if (MVar7 == this->button) {
          local_78 = QGraphicsSceneMouseEvent::scenePos((QGraphicsSceneMouseEvent *)this_03);
          goto LAB_0065f48c;
        }
      }
    }
  }
  else {
    if (uVar2 == 0xc2) {
      IVar22 = InputPress;
    }
    else {
      IVar22 = InputMove;
      if (uVar2 != 0xc3) {
        IVar22 = 0;
        if (uVar2 != 0xc4) goto LAB_0065f688;
        IVar22 = InputRelease;
      }
    }
    QPointerEvent::pointingDevice();
    iVar8 = QInputDevice::type();
    QVar27.i = 1;
    if (iVar8 == 4) {
      if (*(long *)(pQVar21 + 0x38) != 2) goto LAB_0065fed3;
      auVar32 = QEventPoint::scenePressPosition();
      auVar33 = QEventPoint::scenePosition();
      auVar34 = QEventPoint::scenePressPosition();
      auVar35 = QEventPoint::scenePosition();
      auVar36 = QEventPoint::scenePressPosition();
      local_78.yp = auVar32._8_8_ +
                    ((auVar35._8_8_ - auVar36._8_8_) + (auVar33._8_8_ - auVar34._8_8_)) * 0.5;
      local_78.xp = auVar32._0_8_ +
                    ((auVar35._0_8_ - auVar36._0_8_) + (auVar33._0_8_ - auVar34._0_8_)) * 0.5;
    }
    else {
      if (*(long *)(pQVar21 + 0x38) != 1) goto LAB_0065fed3;
      local_78 = (QPointF)QEventPoint::scenePosition();
    }
  }
LAB_0065f688:
  if (IVar22 == InputPress) {
    local_88 = (QScrollerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_98 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = (undefined8 *)&DAT_aaaaaaaaaaaaaaaa;
    QScroller::activeScrollers();
    if (local_88 != (QScrollerPrivate *)0x0) {
      puVar1 = puStack_90 + (long)local_88;
      puVar28 = puStack_90;
      do {
        this_01 = (QScroller *)*puVar28;
        if (this_01 != this_00) {
          local_a0 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
          QRegion::QRegion((QRegion *)&local_a0);
          pQVar17 = (QWidget *)QScroller::target(this_01);
          if (pQVar17 == (QWidget *)0x0) {
            pQVar24 = (QWidget *)0x0;
          }
          else {
            pQVar24 = (QWidget *)0x0;
            if ((*(byte *)(*(long *)&pQVar17->field_0x8 + 0x30) & 1) != 0) {
              pQVar24 = pQVar17;
            }
          }
          if (pQVar24 == (QWidget *)0x0) {
            QScroller::target(this_01);
            lVar14 = QMetaObject::cast((QObject *)&QGraphicsObject::staticMetaObject);
            if (lVar14 != 0) {
              this_04 = (QGraphicsItem *)(lVar14 + 0x10);
              this_02 = (QGraphicsScene *)QGraphicsItem::scene(this_04);
              if (this_02 != (QGraphicsScene *)0x0) {
                local_b8.super_QList<QPointF>.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_b8.super_QList<QPointF>.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_b8.super_QList<QPointF>.d.ptr = (QPointF *)&DAT_aaaaaaaaaaaaaaaa;
                (*this_04->_vptr_QGraphicsItem[3])(&local_58,this_04);
                QGraphicsItem::mapToScene(&local_b8,this_04,(QRectF *)&local_58);
                local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
                local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                QGraphicsScene::views((QList<QGraphicsView_*> *)&local_58,this_02);
                uVar4 = local_58._8_8_;
                if ((undefined1 *)local_58._16_8_ != (undefined1 *)0x0) {
                  lVar14 = local_58._16_8_ << 3;
                  lVar29 = 0;
                  do {
                    pQVar17 = *(QWidget **)(uVar4 + lVar29);
                    QGraphicsView::mapFromScene(&local_f0,(QGraphicsView *)pQVar17,&local_b8);
                    local_f8.xp.m_i = 0;
                    local_f8.yp.m_i = 0;
                    QWidget::mapToGlobal(pQVar17,&local_f8);
                    QPolygon::translated((int)&local_d8,(int)&local_f0);
                    QRegion::QRegion(&local_c0,&local_d8,OddEvenFill);
                    QRegion::operator|=((QRegion *)&local_a0,&local_c0);
                    QRegion::~QRegion(&local_c0);
                    if ((QPoint)local_d8.super_QList<QPoint>.d.d != (QPoint)0x0) {
                      LOCK();
                      *(int *)local_d8.super_QList<QPoint>.d.d =
                           *(int *)local_d8.super_QList<QPoint>.d.d + -1;
                      UNLOCK();
                      if (*(int *)local_d8.super_QList<QPoint>.d.d == 0) {
                        QArrayData::deallocate
                                  (&(local_d8.super_QList<QPoint>.d.d)->super_QArrayData,8,0x10);
                      }
                    }
                    if (&(local_f0.super_QList<QPoint>.d.d)->super_QArrayData != (QArrayData *)0x0)
                    {
                      LOCK();
                      ((local_f0.super_QList<QPoint>.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i =
                           ((local_f0.super_QList<QPoint>.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_f0.super_QList<QPoint>.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i == 0) {
                        QArrayData::deallocate
                                  (&(local_f0.super_QList<QPoint>.d.d)->super_QArrayData,8,0x10);
                      }
                    }
                    lVar29 = lVar29 + 8;
                  } while (lVar14 != lVar29);
                }
                if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
                  LOCK();
                  *(int *)local_58.shared = *(int *)local_58.shared + -1;
                  UNLOCK();
                  if (*(int *)local_58.shared == 0) {
                    QArrayData::deallocate((QArrayData *)local_58.shared,8,0x10);
                  }
                }
                auVar34._8_8_ = local_58._8_8_;
                auVar34._0_8_ = local_58.shared;
                if ((QPoint)local_b8.super_QList<QPointF>.d.d != (QPoint)0x0) {
                  LOCK();
                  *(int *)local_b8.super_QList<QPointF>.d.d =
                       *(int *)local_b8.super_QList<QPointF>.d.d + -1;
                  UNLOCK();
                  local_58._0_16_ = auVar34;
                  if (*(int *)local_b8.super_QList<QPointF>.d.d == 0) {
                    QArrayData::deallocate
                              (&(local_b8.super_QList<QPointF>.d.d)->super_QArrayData,0x10,0x10);
                  }
                }
              }
            }
          }
          else {
            local_d8.super_QList<QPoint>.d.d = (Data *)0x0;
            QVar18 = QWidget::mapToGlobal(pQVar24,(QPoint *)&local_d8);
            pQVar3 = pQVar24->data;
            local_58._12_4_ = ((pQVar3->crect).y2.m_i + QVar18.yp.m_i.m_i) - (pQVar3->crect).y1.m_i;
            local_58._8_4_ = ((pQVar3->crect).x2.m_i + QVar18.xp.m_i.m_i) - (pQVar3->crect).x1.m_i;
            local_58._0_8_ = QVar18;
            QRegion::QRegion((QRegion *)&local_b8,(QRect *)&local_58,Rectangle);
            QVar18 = local_a0;
            local_a0 = (QPoint)local_b8.super_QList<QPointF>.d.d;
            local_b8.super_QList<QPointF>.d.d = (Data *)QVar18;
            QRegion::~QRegion((QRegion *)&local_b8);
          }
          cVar5 = QRegion::contains(&local_a0);
          QRegion::~QRegion((QRegion *)&local_a0);
          if (cVar5 != '\0') {
            if (local_98 != (QArrayData *)0x0) {
              LOCK();
              (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_98,8,0x10);
              }
            }
            goto LAB_0065fe0f;
          }
        }
        puVar28 = puVar28 + 1;
      } while (puVar28 != puVar1);
    }
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98,8,0x10);
      }
    }
  }
  SVar9 = QScroller::state(this_00);
  SVar10 = QScroller::state(this_00);
  if (IVar22 != 0) {
    lVar14 = *(long *)(lVar20 + 0xa8);
    if ((lVar14 == 0) || (*(int *)(lVar14 + 4) == 0)) {
      pQVar17 = (QWidget *)0x0;
    }
    else {
      pQVar17 = *(QWidget **)(lVar20 + 0xb0);
    }
    if (pQVar17 == (QWidget *)0x0) {
      pQVar24 = (QWidget *)0x0;
    }
    else {
      pQVar24 = (QWidget *)0x0;
      if ((*(byte *)(*(long *)&pQVar17->field_0x8 + 0x30) & 1) != 0) {
        pQVar24 = pQVar17;
      }
    }
    if (pQVar24 == (QWidget *)0x0) {
      lVar20 = QMetaObject::cast((QObject *)&QGraphicsObject::staticMetaObject);
      if (lVar20 != 0) {
        local_78 = QGraphicsItem::mapFromScene((QGraphicsItem *)(lVar20 + 0x10),&local_78);
      }
    }
    else {
      auVar35._0_8_ =
           (double)((ulong)local_78.xp & 0x8000000000000000 | 0x3fe0000000000000) + local_78.xp;
      auVar35._8_8_ =
           (double)((ulong)local_78.yp & 0x8000000000000000 | 0x3fe0000000000000) + local_78.yp;
      auVar32 = minpd(_DAT_0066f5d0,auVar35);
      auVar36._8_8_ = -(ulong)(-2147483648.0 < auVar32._8_8_);
      auVar36._0_8_ = -(ulong)(-2147483648.0 < auVar32._0_8_);
      uVar11 = movmskpd((int)lVar14,auVar36);
      uVar23 = 0x8000000000000000;
      if ((uVar11 & 2) != 0) {
        uVar23 = (ulong)(uint)(int)auVar32._8_8_ << 0x20;
      }
      uVar19 = 0x80000000;
      if ((uVar11 & 1) != 0) {
        uVar19 = (ulong)(uint)(int)auVar32._0_8_;
      }
      local_58.shared = (PrivateShared *)(uVar19 | uVar23);
      QVar18 = QWidget::mapFromGlobal(pQVar24,(QPoint *)&local_58.shared);
      local_78.yp = (double)QVar18.yp.m_i.m_i;
      local_78.xp = (double)QVar18.xp.m_i.m_i;
    }
    timestamp = QElapsedTimer::elapsed();
    QScroller::handleInput(this_00,IVar22,&local_78,timestamp);
  }
  SVar13 = QScroller::state(this_00);
  scrollerIsActive = true;
  if (SVar13 != Dragging) {
    SVar13 = QScroller::state(this_00);
    scrollerIsActive = SVar13 == Scrolling;
  }
  if (bVar30) {
    if (((SVar9 == Dragging) || (SVar10 == Scrolling)) || (scrollerIsActive != true)) {
      if (SVar10 == Scrolling) {
        SVar13 = QScroller::state(this_00);
        if (SVar13 != Dragging) {
          SVar13 = QScroller::state(this_00);
          if (SVar13 != Inactive) goto LAB_0065fcd2;
        }
        pPVar15 = PressDelayHandler::instance();
        PressDelayHandler::scrollerWasIntercepted(pPVar15);
      }
    }
    else {
      pPVar15 = PressDelayHandler::instance();
      PressDelayHandler::scrollerBecameActive
                (pPVar15,(KeyboardModifiers)local_1a4.i,(MouseButtons)eventButtons.i);
    }
  }
LAB_0065fcd2:
  uVar11 = (uint)(byte)(bVar30 & scrollerIsActive) << 8;
  if (IVar22 != 0) {
    uVar2 = *(ushort *)(event + 8);
    uVar26 = uVar11;
    if (uVar2 < 0x9c) {
      if (uVar2 < 5) {
        if (uVar2 == 2) goto LAB_0065fe1a;
        if (uVar2 == 3) goto LAB_0065fd8c;
      }
      else if ((uVar2 == 5) || (uVar2 == 0x9b)) {
        pPVar15 = PressDelayHandler::instance();
        uVar26 = 0x100;
        if ((pPVar15->pressDelayEvent).d == (QMouseEvent *)0x0) {
          uVar26 = uVar11;
        }
LAB_0065fd6f:
        uVar11 = (uint)scrollerIsActive + (uint)scrollerIsActive * 2 + 1;
LAB_0065fdd2:
        QVar27.i = uVar11 | uVar26;
        goto LAB_0065fed3;
      }
    }
    else if (uVar2 < 0xc2) {
      if (uVar2 == 0x9c) {
LAB_0065fe1a:
        SVar9 = QScroller::state(this_00);
        if (SVar9 == Pressed) {
          QScroller::scrollerProperties((QScroller *)&local_98);
          QScrollerProperties::scrollMetric
                    ((QVariant *)&local_58,(QScrollerProperties *)&local_98,MousePressEventDelay);
          dVar31 = (double)::QVariant::toReal((bool *)local_58.data);
          ::QVariant::~QVariant((QVariant *)&local_58);
          QScrollerProperties::~QScrollerProperties((QScrollerProperties *)&local_98);
          if (0 < (int)(dVar31 * 1000.0)) {
            pPVar15 = PressDelayHandler::instance();
            PressDelayHandler::pressed(pPVar15,event,(int)(dVar31 * 1000.0));
            event[0xc] = (QEvent)0x1;
            uVar11 = 0x100;
          }
        }
        goto LAB_0065feaa;
      }
      if (uVar2 == 0x9d) {
LAB_0065fd8c:
        pPVar15 = PressDelayHandler::instance();
        bVar30 = PressDelayHandler::released
                           (pPVar15,event,SVar9 == Dragging || SVar10 == Scrolling,scrollerIsActive)
        ;
        if (bVar30) {
          uVar26 = 0x100;
        }
LAB_0065fdc3:
        uVar11 = (uint)(scrollerIsActive ^ 1) * 8 + 8;
        goto LAB_0065fdd2;
      }
    }
    else {
      if (uVar2 == 0xc2) {
LAB_0065feaa:
        local_58._forAlignment = (double)local_60.xp.m_i.m_i;
        local_58._8_8_ = (undefined8)local_60.yp.m_i.m_i;
        QGesture::setHotSpot(state,(QPointF *)&local_58);
        QVar27.i = uVar11 + (uint)scrollerIsActive * 2 + 2;
        goto LAB_0065fed3;
      }
      if (uVar2 == 0xc3) goto LAB_0065fd6f;
      if (uVar2 == 0xc4) goto LAB_0065fdc3;
    }
  }
  QVar27.i = uVar11 | 1;
LAB_0065fed3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QFlagsStorageHelper<QGestureRecognizer::ResultFlag,_4>)
         (QFlagsStorageHelper<QGestureRecognizer::ResultFlag,_4>)QVar27.i;
}

Assistant:

QGestureRecognizer::Result QFlickGestureRecognizer::recognize(QGesture *state,
                                                              QObject *watched,
                                                              QEvent *event)
{
    Q_UNUSED(watched);

    Q_CONSTINIT static QElapsedTimer monotonicTimer;
    if (!monotonicTimer.isValid())
        monotonicTimer.start();

    QFlickGesture *q = static_cast<QFlickGesture *>(state);
    QFlickGesturePrivate *d = q->d_func();

    QScroller *scroller = d->receiverScroller;
    if (!scroller)
        return Ignore; // nothing to do without a scroller?

    QWidget *receiverWidget = qobject_cast<QWidget *>(d->receiver);
#if QT_CONFIG(graphicsview)
    QGraphicsObject *receiverGraphicsObject = qobject_cast<QGraphicsObject *>(d->receiver);
#endif

    // this is only set for events that we inject into the event loop via sendEvent()
    if (PressDelayHandler::instance()->shouldEventBeIgnored(event)) {
        //qFGDebug() << state << "QFG: ignored event: " << event->type();
        return Ignore;
    }

    const QMouseEvent *me = nullptr;
#if QT_CONFIG(graphicsview)
    const QGraphicsSceneMouseEvent *gsme = nullptr;
#endif
    const QTouchEvent *te = nullptr;
    QPoint globalPos;

    // qFGDebug() << "FlickGesture "<<state<<"watched:"<<watched<<"receiver"<<d->receiver<<"event"<<event->type()<<"button"<<button;

    Qt::KeyboardModifiers keyboardModifiers = Qt::NoModifier;
    Qt::MouseButtons mouseButtons = Qt::NoButton;
    switch (event->type()) {
    case QEvent::MouseButtonPress:
    case QEvent::MouseButtonRelease:
    case QEvent::MouseMove:
        if (!receiverWidget)
            return Ignore;
        if (button != Qt::NoButton) {
            me = static_cast<const QMouseEvent *>(event);
            keyboardModifiers = me->modifiers();
            mouseButtons = me->buttons();
            globalPos = me->globalPosition().toPoint();
        }
        break;
#if QT_CONFIG(graphicsview)
    case QEvent::GraphicsSceneMousePress:
    case QEvent::GraphicsSceneMouseRelease:
    case QEvent::GraphicsSceneMouseMove:
        if (!receiverGraphicsObject)
            return Ignore;
        if (button != Qt::NoButton) {
            gsme = static_cast<const QGraphicsSceneMouseEvent *>(event);
            keyboardModifiers = gsme->modifiers();
            mouseButtons = gsme->buttons();
            globalPos = gsme->screenPos();
        }
        break;
#endif
    case QEvent::TouchBegin:
    case QEvent::TouchEnd:
    case QEvent::TouchUpdate:
        if (button == Qt::NoButton) {
            te = static_cast<const QTouchEvent *>(event);
            keyboardModifiers = te->modifiers();
            if (!te->points().isEmpty())
                globalPos = te->points().at(0).globalPosition().toPoint();
        }
        break;

    // consume all wheel events if the scroller is active
    case QEvent::Wheel:
        if (d->macIgnoreWheel || (scroller->state() != QScroller::Inactive))
            return Ignore | ConsumeEventHint;
        break;

    // consume all dbl click events if the scroller is active
    case QEvent::MouseButtonDblClick:
        if (scroller->state() != QScroller::Inactive)
            return Ignore | ConsumeEventHint;
        break;

    default:
        break;
    }

    if (!me
#if QT_CONFIG(graphicsview)
        && !gsme
#endif
        && !te) // Neither mouse nor touch
        return Ignore;

    // get the current pointer position in local coordinates.
    QPointF point;
    QScroller::Input inputType = (QScroller::Input) 0;

    switch (event->type()) {
    case QEvent::MouseButtonPress:
        if (me && me->button() == button && me->buttons() == button) {
            point = me->globalPosition().toPoint();
            inputType = QScroller::InputPress;
        } else if (me) {
            scroller->stop();
            return CancelGesture;
        }
        break;
    case QEvent::MouseButtonRelease:
        if (me && me->button() == button) {
            point = me->globalPosition().toPoint();
            inputType = QScroller::InputRelease;
        }
        break;
    case QEvent::MouseMove:
        if (me && me->buttons() == button) {
            point = me->globalPosition().toPoint();
            inputType = QScroller::InputMove;
        }
        break;

#if QT_CONFIG(graphicsview)
    case QEvent::GraphicsSceneMousePress:
        if (gsme && gsme->button() == button && gsme->buttons() == button) {
            point = gsme->scenePos();
            inputType = QScroller::InputPress;
        } else if (gsme) {
            scroller->stop();
            return CancelGesture;
        }
        break;
    case QEvent::GraphicsSceneMouseRelease:
        if (gsme && gsme->button() == button) {
            point = gsme->scenePos();
            inputType = QScroller::InputRelease;
        }
        break;
    case QEvent::GraphicsSceneMouseMove:
        if (gsme && gsme->buttons() == button) {
            point = gsme->scenePos();
            inputType = QScroller::InputMove;
        }
        break;
#endif

    case QEvent::TouchBegin:
        inputType = QScroller::InputPress;
        Q_FALLTHROUGH();
    case QEvent::TouchEnd:
        if (!inputType)
            inputType = QScroller::InputRelease;
        Q_FALLTHROUGH();
    case QEvent::TouchUpdate:
        if (!inputType)
            inputType = QScroller::InputMove;

        if (te->pointingDevice()->type() == QInputDevice::DeviceType::TouchPad) {
            if (te->points().size() != 2)  // 2 fingers on pad
                return Ignore;

            point = te->points().at(0).scenePressPosition() +
                    ((te->points().at(0).scenePosition() - te->points().at(0).scenePressPosition()) +
                     (te->points().at(1).scenePosition() - te->points().at(1).scenePressPosition())) / 2;
        } else { // TouchScreen
            if (te->points().size() != 1) // 1 finger on screen
                return Ignore;

            point = te->points().at(0).scenePosition();
        }
        break;

    default:
        break;
    }

    // Check for an active scroller at globalPos
    if (inputType == QScroller::InputPress) {
        const auto activeScrollers = QScroller::activeScrollers();
        for (QScroller *as : activeScrollers) {
            if (as != scroller) {
                QRegion scrollerRegion;

                if (QWidget *w = qobject_cast<QWidget *>(as->target())) {
                    scrollerRegion = QRect(w->mapToGlobal(QPoint(0, 0)), w->size());
#if QT_CONFIG(graphicsview)
                } else if (QGraphicsObject *go = qobject_cast<QGraphicsObject *>(as->target())) {
                    if (const auto *scene = go->scene()) {
                        const auto goBoundingRectMappedToScene = go->mapToScene(go->boundingRect());
                        const auto views = scene->views();
                        for (QGraphicsView *gv : views) {
                            scrollerRegion |= gv->mapFromScene(goBoundingRectMappedToScene)
                                              .translated(gv->mapToGlobal(QPoint(0, 0)));
                        }
                    }
#endif
                }
                // active scrollers always have priority
                if (scrollerRegion.contains(globalPos))
                    return Ignore;
            }
        }
    }

    bool scrollerWasDragging = (scroller->state() == QScroller::Dragging);
    bool scrollerWasScrolling = (scroller->state() == QScroller::Scrolling);

    if (inputType) {
        if (QWidget *w = qobject_cast<QWidget *>(d->receiver))
            point = w->mapFromGlobal(point.toPoint());
#if QT_CONFIG(graphicsview)
        else if (QGraphicsObject *go = qobject_cast<QGraphicsObject *>(d->receiver))
            point = go->mapFromScene(point);
#endif

        // inform the scroller about the new event
        scroller->handleInput(inputType, point, monotonicTimer.elapsed());
    }

    // depending on the scroller state return the gesture state
    Result result;
    bool scrollerIsActive = (scroller->state() == QScroller::Dragging ||
                             scroller->state() == QScroller::Scrolling);

    // Consume all mouse events while dragging or scrolling to avoid nasty
    // side effects with Qt's standard widgets.
    if ((me
#if QT_CONFIG(graphicsview)
         || gsme
#endif
         ) && scrollerIsActive)
        result |= ConsumeEventHint;

    // The only problem with this approach is that we consume the
    // MouseRelease when we start the scrolling with a flick gesture, so we
    // have to fake a MouseRelease "somewhere" to not mess with the internal
    // states of Qt's widgets (a QPushButton would stay in 'pressed' state
    // forever, if it doesn't receive a MouseRelease).
    if (me
#if QT_CONFIG(graphicsview)
        || gsme
#endif
        ) {
        if (!scrollerWasDragging && !scrollerWasScrolling && scrollerIsActive)
            PressDelayHandler::instance()->scrollerBecameActive(keyboardModifiers, mouseButtons);
        else if (scrollerWasScrolling && (scroller->state() == QScroller::Dragging || scroller->state() == QScroller::Inactive))
            PressDelayHandler::instance()->scrollerWasIntercepted();
    }

    if (!inputType) {
        result |= Ignore;
    } else {
        switch (event->type()) {
        case QEvent::MouseButtonPress:
#if QT_CONFIG(graphicsview)
        case QEvent::GraphicsSceneMousePress:
#endif
            if (scroller->state() == QScroller::Pressed) {
                int pressDelay = int(1000 * scroller->scrollerProperties().scrollMetric(QScrollerProperties::MousePressEventDelay).toReal());
                if (pressDelay > 0) {
                    result |= ConsumeEventHint;

                    PressDelayHandler::instance()->pressed(event, pressDelay);
                    event->accept();
                }
            }
            Q_FALLTHROUGH();
        case QEvent::TouchBegin:
            q->setHotSpot(globalPos);
            result |= scrollerIsActive ? TriggerGesture : MayBeGesture;
            break;

        case QEvent::MouseMove:
#if QT_CONFIG(graphicsview)
        case QEvent::GraphicsSceneMouseMove:
#endif
            if (PressDelayHandler::instance()->isDelaying())
                result |= ConsumeEventHint;
            Q_FALLTHROUGH();
        case QEvent::TouchUpdate:
            result |= scrollerIsActive ? TriggerGesture : Ignore;
            break;

#if QT_CONFIG(graphicsview)
        case QEvent::GraphicsSceneMouseRelease:
#endif
        case QEvent::MouseButtonRelease:
            if (PressDelayHandler::instance()->released(event, scrollerWasDragging || scrollerWasScrolling, scrollerIsActive))
                result |= ConsumeEventHint;
            Q_FALLTHROUGH();
        case QEvent::TouchEnd:
            result |= scrollerIsActive ? FinishGesture : CancelGesture;
            break;

        default:
            result |= Ignore;
            break;
        }
    }
    return result;
}